

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.h
# Opt level: O0

void __thiscall cfd::core::AdaptorProof::~AdaptorProof(AdaptorProof *this)

{
  AdaptorProof *this_local;
  
  ByteData::~ByteData((ByteData *)this);
  return;
}

Assistant:

class CFD_CORE_EXPORT AdaptorProof {
 public:
  /**
   * @brief The size of an adaptor proof.
   *
   */
  static constexpr uint32_t kAdaptorProofSize = 97;
  /**
   * @brief Construct a new Adaptor Proof from ByteData
   *
   * @param data the data representing the proof
   */
  explicit AdaptorProof(const ByteData &data);
  /**
   * @brief Construct a new Adaptor Proof object from a string
   *
   * @param data the data representing the proof
   */
  explicit AdaptorProof(const std::string &data);

  /**
   * @brief Get the underlying ByteData object.
   *
   * @return ByteData
   */
  ByteData GetData() const;

 private:
  /**
   * @brief The underlying data
   *
   */
  ByteData data_;
}